

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::ReadPropertyIdOfFormals
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type TVar1;
  ByteCodeCache *this_00;
  int local_44;
  int i_1;
  PropertyId propertyId;
  uint i;
  int id;
  bool hasNonSimpleParams;
  bool has__proto__;
  bool hadDuplicates;
  PropertyIdArray *propIds;
  byte extraSlotCount;
  FunctionBody *pFStack_20;
  uint32 count;
  FunctionBody *function_local;
  byte *current_local;
  ByteCodeBufferReader *this_local;
  
  propIds._4_4_ = 0;
  pFStack_20 = function;
  function_local = (FunctionBody *)current;
  current_local = (byte *)this;
  function_local = (FunctionBody *)ReadUInt32(this,current,(uint *)((long)&propIds + 4));
  propIds._3_1_ = 0;
  function_local =
       (FunctionBody *)ReadByte(this,(byte *)function_local,(byte *)((long)&propIds + 3));
  _id = FunctionBody::AllocatePropertyIdArrayForFormals
                  (pFStack_20,(propIds._3_1_ + propIds._4_4_) * 4,propIds._4_4_,propIds._3_1_);
  _id->count = propIds._4_4_;
  i._3_1_ = 0;
  function_local = (FunctionBody *)ReadBool(this,(byte *)function_local,(bool *)((long)&i + 3));
  _id->hadDuplicates = (Type)(i._3_1_ & 1);
  i._2_1_ = 0;
  function_local = (FunctionBody *)ReadBool(this,(byte *)function_local,(bool *)((long)&i + 2));
  _id->has__proto__ = (Type)(i._2_1_ & 1);
  i._1_1_ = 0;
  function_local = (FunctionBody *)ReadBool(this,(byte *)function_local,(bool *)((long)&i + 1));
  _id->hasNonSimpleParams = (Type)(i._1_1_ & 1);
  propertyId = 0;
  for (i_1 = 0; (uint)i_1 < _id->count; i_1 = i_1 + 1) {
    function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&propertyId);
    this_00 = FunctionBody::GetByteCodeCache(pFStack_20);
    TVar1 = ByteCodeCache::LookupPropertyId(this_00,propertyId);
    (&_id[1].count)[(uint)i_1] = TVar1;
  }
  for (local_44 = 0; local_44 < (int)(uint)propIds._3_1_; local_44 = local_44 + 1) {
    function_local = (FunctionBody *)ReadInt32(this,(byte *)function_local,&propertyId);
    (&_id[1].count)[_id->count + local_44] = propertyId;
  }
  return (byte *)function_local;
}

Assistant:

const byte * ReadPropertyIdOfFormals(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant = 0;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfPropIdsOfFormals);
#endif

        uint32 count = 0;
        current = ReadUInt32(current, &count);

        byte extraSlotCount = 0;
        current = ReadByte(current, &extraSlotCount);

        PropertyIdArray * propIds = function->AllocatePropertyIdArrayForFormals((extraSlotCount + count) * sizeof(PropertyId), count, extraSlotCount);
        propIds->count = count;

        bool hadDuplicates = false;
        current = ReadBool(current, &hadDuplicates);
        propIds->hadDuplicates = hadDuplicates;

        bool has__proto__ = false;
        current = ReadBool(current, &has__proto__);
        propIds->has__proto__ = has__proto__;

        bool hasNonSimpleParams = false;
        current = ReadBool(current, &hasNonSimpleParams);
        propIds->hasNonSimpleParams = hasNonSimpleParams;

        int id = 0;
        for (uint i = 0; i < propIds->count; ++i)
        {
            current = ReadInt32(current, &id);
            PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
            propIds->elements[i] = propertyId;
        }

        for (int i = 0; i < extraSlotCount; ++i)
        {
            current = ReadInt32(current, &id);
            propIds->elements[propIds->count + i] = id;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfPropIdsOfFormals);
#endif

        return current;
    }